

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::CommonEdgeCase::CommonEdgeCase
          (CommonEdgeCase *this,Context *context,char *name,char *description,CaseType caseType)

{
  int local_60;
  int local_58;
  CaseType caseType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  CommonEdgeCase *this_local;
  
  MultisampleCase::MultisampleCase(&this->super_MultisampleCase,context,name,description);
  (this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonEdgeCase_0328bde8;
  this->m_caseType = caseType;
  if (caseType == CASETYPE_SMALL_QUADS) {
    local_58 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx,0x10);
  }
  else {
    if (caseType == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD) {
      local_60 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx,0x40);
    }
    else {
      local_60 = 8;
    }
    local_58 = local_60;
  }
  this->m_numIterations = local_58;
  this->m_currentIteration = 0;
  return;
}

Assistant:

CommonEdgeCase::CommonEdgeCase (Context& context, const char* name, const char* description, CaseType caseType)
	: MultisampleCase		(context, name, description)
	, m_caseType			(caseType)
	, m_numIterations		(caseType == CASETYPE_SMALL_QUADS					? getIterationCount(m_testCtx, DEFAULT_SMALL_QUADS_ITERATIONS)
							: caseType == CASETYPE_BIGGER_THAN_VIEWPORT_QUAD	? getIterationCount(m_testCtx, DEFAULT_BIGGER_THAN_VIEWPORT_QUAD_ITERATIONS)
							: 8)
	, m_currentIteration	(0)
{
}